

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
find<0ul,kj::String&>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *this,
          String *params)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  uint hash;
  uint uVar8;
  int iVar9;
  char *__s2;
  uint *puVar10;
  Maybe<kj::StringPtr_&> MVar11;
  ulong uVar12;
  ulong uVar13;
  uchar *puVar14;
  ulong unaff_R12;
  ArrayPtr<const_unsigned_char> s;
  
  if (*(long *)(this + 0x38) != 0) {
    sVar2 = (params->content).size_;
    if (sVar2 == 0) {
      puVar14 = "";
    }
    else {
      puVar14 = (uchar *)(params->content).ptr;
    }
    lVar3 = *(long *)this;
    s.size_ = (sVar2 - 1) + (ulong)(sVar2 == 0);
    s.ptr = puVar14;
    hash = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    uVar8 = _::chooseBucket(hash,*(uint *)(this + 0x38));
    lVar4 = *(long *)(this + 0x30);
    uVar12 = (ulong)uVar8;
    uVar1 = *(uint *)(lVar4 + 4 + uVar12 * 8);
    unaff_R12 = (ulong)uVar1;
    if (uVar1 != 0) {
      sVar2 = (params->content).size_;
      if (sVar2 == 0) {
        __s2 = "";
      }
      else {
        __s2 = (params->content).ptr;
      }
      puVar10 = (uint *)(lVar4 + uVar12 * 8);
      uVar5 = *(ulong *)(this + 0x38);
      do {
        if (((int)unaff_R12 != 1) && (*puVar10 == hash)) {
          unaff_R12 = (ulong)((int)unaff_R12 - 2);
          lVar6 = *(long *)(lVar3 + 8 + unaff_R12 * 0x10);
          if ((lVar6 == sVar2 + (sVar2 == 0)) &&
             (iVar9 = bcmp(*(void **)(unaff_R12 * 0x10 + lVar3),__s2,lVar6 - 1), iVar9 == 0)) {
            bVar7 = true;
            break;
          }
        }
        uVar13 = uVar12 + 1;
        bVar7 = false;
        uVar12 = 0;
        if (uVar13 != uVar5) {
          uVar12 = uVar13 & 0xffffffff;
        }
        puVar10 = (uint *)(lVar4 + uVar12 * 8);
        unaff_R12 = (ulong)puVar10[1];
      } while (puVar10[1] != 0);
      goto LAB_0014c77c;
    }
  }
  bVar7 = false;
LAB_0014c77c:
  MVar11.ptr = (StringPtr *)0x0;
  if (bVar7) {
    MVar11.ptr = (StringPtr *)(unaff_R12 * 0x10 + *(long *)this);
  }
  return (Maybe<kj::StringPtr_&>)MVar11.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}